

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O3

Ratio * Ratio::combine(Ratio *__return_storage_ptr__,Ratio *r1,Ratio *r2)

{
  (__return_storage_ptr__->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->eLength = 0.0;
  __return_storage_ptr__->fLength = 0.0;
  if (((r1->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (r1->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     ((r2->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (r2->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    __return_storage_ptr__->eLength = SQRT(r2->eLength * r2->eLength + r1->eLength * r1->eLength);
  }
  else {
    setAllEEdges(__return_storage_ptr__,&r1->eEdges);
    addAllEEdges(__return_storage_ptr__,&r2->eEdges);
  }
  if (((r1->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (r1->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     ((r2->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (r2->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if ((__return_storage_ptr__->fEdges).
        super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->fEdges).
        super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __return_storage_ptr__->fLength = SQRT(r2->fLength * r2->fLength + r1->fLength * r1->fLength);
    }
  }
  else {
    setAllFEdges(__return_storage_ptr__,&r1->fEdges);
    addAllFEdges(__return_storage_ptr__,&r2->fEdges);
  }
  return __return_storage_ptr__;
}

Assistant:

Ratio Ratio::combine(Ratio& r1, Ratio& r2) {
    Ratio r{};
    if ((r1.eEdges.empty()) && (r2.eEdges.empty())) {
        r.setELength(geoAvg(r1.eLength, r2.eLength));
    }
    else {
        r.setAllEEdges(r1.eEdges);
        r.addAllEEdges(r2.eEdges);
    }

    if ((r1.fEdges.empty()) && (r2.fEdges.empty())) {
        r.setFLength(geoAvg(r1.fLength, r2.fLength));
    }
    else {
        r.setAllFEdges(r1.fEdges);
        r.addAllFEdges(r2.fEdges);
    }
    return r;
}